

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sVertexArrayTests.cpp
# Opt level: O0

int __thiscall deqp::gles2::Stress::VertexArrayTests::init(VertexArrayTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *node;
  TestNode *pTVar1;
  TestCaseGroup *group;
  VertexArrayTests *this_local;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_attribute","Single attribute");
  tcu::TestNode::addChild((TestNode *)this,node);
  pTVar1 = (TestNode *)operator_new(0x78);
  anon_unknown_1::SingleVertexArrayStrideTests::SingleVertexArrayStrideTests
            ((SingleVertexArrayStrideTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  anon_unknown_1::SingleVertexArrayUsageTests::SingleVertexArrayUsageTests
            ((SingleVertexArrayUsageTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  anon_unknown_1::SingleVertexArrayOffsetTests::SingleVertexArrayOffsetTests
            ((SingleVertexArrayOffsetTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  anon_unknown_1::SingleVertexArrayFirstTests::SingleVertexArrayFirstTests
            ((SingleVertexArrayFirstTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node,pTVar1);
  return extraout_EAX;
}

Assistant:

void VertexArrayTests::init (void)
{
	tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "single_attribute", "Single attribute");
	addChild(group);

	// .single_attribute
	{
		group->addChild(new SingleVertexArrayStrideTests(m_context));
		group->addChild(new SingleVertexArrayUsageTests(m_context));
		group->addChild(new SingleVertexArrayOffsetTests(m_context));
		group->addChild(new SingleVertexArrayFirstTests(m_context));
	}
}